

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode Curl_cf_udp_create(Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,
                           int transport)

{
  uint uVar1;
  CURLcode CVar2;
  int *__s;
  Curl_cfilter *pCVar3;
  undefined8 uVar4;
  Curl_cfilter *cf;
  Curl_cfilter *local_30;
  
  local_30 = (Curl_cfilter *)0x0;
  __s = (int *)(*Curl_ccalloc)(1,0x138);
  if (__s == (int *)0x0) {
    *pcf = (Curl_cfilter *)0x0;
    CVar2 = CURLE_OUT_OF_MEMORY;
    pCVar3 = (Curl_cfilter *)0x0;
  }
  else {
    memset(__s,0,0x138);
    __s[0x26] = -1;
    *__s = transport;
    __s[2] = ai->ai_family;
    if (transport == 3) {
      uVar4 = 0x600000001;
    }
    else if (transport == 6) {
      uVar4 = 1;
    }
    else {
      uVar4 = 0x1100000002;
    }
    *(undefined8 *)(__s + 3) = uVar4;
    uVar1 = 0x80;
    if (ai->ai_addrlen < 0x80) {
      uVar1 = ai->ai_addrlen;
    }
    __s[5] = uVar1;
    memcpy(__s + 6,ai->ai_addr,(ulong)uVar1);
    CVar2 = Curl_cf_create(&local_30,&Curl_cft_udp,__s);
    pCVar3 = (Curl_cfilter *)0x0;
    if (CVar2 == CURLE_OK) {
      pCVar3 = local_30;
    }
    *pcf = pCVar3;
    pCVar3 = local_30;
    if (CVar2 == CURLE_OK) {
      return CURLE_OK;
    }
  }
  (*Curl_cfree)(pCVar3);
  local_30 = (Curl_cfilter *)0x0;
  (*Curl_cfree)(__s);
  return CVar2;
}

Assistant:

CURLcode Curl_cf_udp_create(struct Curl_cfilter **pcf,
                            struct Curl_easy *data,
                            struct connectdata *conn,
                            const struct Curl_addrinfo *ai,
                            int transport)
{
  struct cf_socket_ctx *ctx = NULL;
  struct Curl_cfilter *cf = NULL;
  CURLcode result;

  (void)data;
  (void)conn;
  DEBUGASSERT(transport == TRNSPRT_UDP || transport == TRNSPRT_QUIC);
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  cf_socket_ctx_init(ctx, ai, transport);

  result = Curl_cf_create(&cf, &Curl_cft_udp, ctx);

out:
  *pcf = (!result) ? cf : NULL;
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }

  return result;
}